

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O2

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeQuad>::Solution
          (TPZCompElHDiv<pzshape::TPZShapeQuad> *this,TPZVec<double> *qsi,int var,
          TPZVec<double> *sol)

{
  TPZMaterialDataT<double> data;
  
  if (var == 99) {
    TPZInterpolationSpace::SolutionInternal<double>((TPZInterpolationSpace *)this,qsi,99,sol);
    return;
  }
  TPZMaterialDataT<double>::TPZMaterialDataT(&data);
  TPZInterpolationSpace::ComputeSolution((TPZInterpolationSpace *)this,qsi,&data,false);
  TPZVec<double>::operator=
            (sol,&(data.sol.super_TPZVec<TPZManVector<double,_10>_>.fStore)->super_TPZVec<double>);
  TPZMaterialDataT<double>::~TPZMaterialDataT(&data);
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>:: Solution(TPZVec<REAL> &qsi,int var,TPZVec<STATE> &sol)
{
    //TODOCOMPLEX
    if (var == 99) {
        return TPZIntelGen<TSHAPE>::Solution(qsi,var,sol);
    }
    TPZMaterialDataT<STATE> data;
    constexpr bool hasPhi{false};
    this->ComputeSolution(qsi,data,hasPhi);
    sol = std::move(data.sol[0]);
}